

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
* __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this,string *makeProgram,
          string *param_2,string *param_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targetNames,string *param_5,bool fast,int jobs,bool verbose,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  initializer_list<cmGlobalGenerator::GeneratedMakeCommand> __l;
  bool bVar1;
  reference ppcVar2;
  string *psVar3;
  const_iterator start;
  const_iterator end;
  reference pbVar4;
  ulong uVar5;
  cmState *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  allocator<cmGlobalGenerator::GeneratedMakeCommand> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  size_type local_210;
  cmStateSnapshot local_208;
  cmStateDirectory local_1f0;
  string local_1c8;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tname;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  GeneratedMakeCommand makeCommand;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> local_d0;
  cmStateDirectory local_c8;
  cmStateDirectory local_a0;
  undefined1 local_68 [8];
  cmStateSnapshot snapshot;
  cmMakefile *mf;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> mfu;
  bool verbose_local;
  bool fast_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targetNames_local;
  string *param_3_local;
  string *param_2_local;
  string *makeProgram_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  mfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl._7_1_ = fast;
  mfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl._6_1_ = verbose;
  std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>::
  unique_ptr<std::default_delete<cmMakefile>,void>
            ((unique_ptr<cmMakefile,std::default_delete<cmMakefile>> *)&mf);
  bVar1 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::empty
                    (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles);
  if (bVar1) {
    cmake::GetCurrentSnapshot
              ((cmStateSnapshot *)local_68,
               (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
    cmStateSnapshot::GetDirectory(&local_a0,(cmStateSnapshot *)local_68);
    psVar3 = cmake::GetHomeDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    cmStateDirectory::SetCurrentSource(&local_a0,psVar3);
    cmStateSnapshot::GetDirectory(&local_c8,(cmStateSnapshot *)local_68);
    psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    cmStateDirectory::SetCurrentBinary(&local_c8,psVar3);
    cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_68);
    makeCommand.super_GeneratedMakeCommand._24_8_ = this;
    std::make_unique<cmMakefile,cmGlobalUnixMakefileGenerator3*,cmStateSnapshot&>
              ((cmGlobalUnixMakefileGenerator3 **)&local_d0,
               (cmStateSnapshot *)&makeCommand.super_GeneratedMakeCommand.RequiresOutputForward);
    std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator=
              ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&mf,&local_d0);
    std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&local_d0);
    snapshot.Position.Position =
         (PositionType)
         std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get
                   ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&mf);
  }
  else {
    ppcVar2 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,0)
    ;
    snapshot.Position.Position = (PositionType)*ppcVar2;
  }
  cmGlobalGenerator::GeneratedMakeCommand::GeneratedMakeCommand((GeneratedMakeCommand *)local_f8);
  if ((mfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl._6_1_ & 1) != 0) {
    psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    detail::GeneratedMakeCommand::Add<std::__cxx11::string_const&>
              ((GeneratedMakeCommand *)local_f8,psVar3);
    detail::GeneratedMakeCommand::Add<char_const(&)[3]>
              ((GeneratedMakeCommand *)local_f8,(char (*) [3])"-E");
    detail::GeneratedMakeCommand::Add<char_const(&)[4]>
              ((GeneratedMakeCommand *)local_f8,(char (*) [4])"env");
    detail::GeneratedMakeCommand::Add<char_const(&)[10]>
              ((GeneratedMakeCommand *)local_f8,(char (*) [10])"VERBOSE=1");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_139);
  cmGlobalGenerator::SelectMakeProgram(&local_118,(cmGlobalGenerator *)this,makeProgram,&local_138);
  detail::GeneratedMakeCommand::Add<std::__cxx11::string>
            ((GeneratedMakeCommand *)local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  if ((jobs != -1) &&
     (detail::GeneratedMakeCommand::Add<char_const(&)[3]>
                ((GeneratedMakeCommand *)local_f8,(char (*) [3])"-j"), jobs != 0)) {
    std::__cxx11::to_string(&local_160,jobs);
    detail::GeneratedMakeCommand::Add<std::__cxx11::string>
              ((GeneratedMakeCommand *)local_f8,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  start = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(makeOptions);
  end = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(makeOptions);
  detail::GeneratedMakeCommand::Add((GeneratedMakeCommand *)local_f8,start,end);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(targetNames);
  tname.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(targetNames);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&tname.field_2 + 8)), bVar1) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_1a8,(string *)pbVar4);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      if ((mfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl._7_1_ & 1) != 0) {
        std::__cxx11::string::operator+=((string *)local_1a8,"/fast");
      }
      cmMakefile::GetStateSnapshot(&local_208,(cmMakefile *)snapshot.Position.Position);
      cmStateSnapshot::GetDirectory(&local_1f0,&local_208);
      this_00 = cmMakefile::GetState((cmMakefile *)snapshot.Position.Position);
      psVar3 = cmState::GetBinaryDirectory_abi_cxx11_(this_00);
      cmStateDirectory::ConvertToRelPathIfNotContained
                (&local_1c8,&local_1f0,psVar3,(string *)local_1a8);
      std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      cmSystemTools::ConvertToOutputSlashes((string *)local_1a8);
      detail::GeneratedMakeCommand::Add<std::__cxx11::string>
                ((GeneratedMakeCommand *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    }
    std::__cxx11::string::~string((string *)local_1a8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmGlobalGenerator::GeneratedMakeCommand::GeneratedMakeCommand
            ((GeneratedMakeCommand *)&local_238,(GeneratedMakeCommand *)local_f8);
  local_210 = 1;
  local_218 = &local_238;
  std::allocator<cmGlobalGenerator::GeneratedMakeCommand>::allocator(&local_239);
  __l._M_len = local_210;
  __l._M_array = (iterator)local_218;
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::vector(__return_storage_ptr__,__l,&local_239);
  std::allocator<cmGlobalGenerator::GeneratedMakeCommand>::~allocator(&local_239);
  local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218;
  do {
    local_2d0 = local_2d0 + -1;
    cmGlobalGenerator::GeneratedMakeCommand::~GeneratedMakeCommand
              ((GeneratedMakeCommand *)local_2d0);
  } while (local_2d0 != &local_238);
  cmGlobalGenerator::GeneratedMakeCommand::~GeneratedMakeCommand((GeneratedMakeCommand *)local_f8);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&mf);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGlobalGenerator::GeneratedMakeCommand>
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand(
  const std::string& makeProgram, const std::string& /*projectName*/,
  const std::string& /*projectDir*/,
  std::vector<std::string> const& targetNames, const std::string& /*config*/,
  bool fast, int jobs, bool verbose,
  std::vector<std::string> const& makeOptions)
{
  std::unique_ptr<cmMakefile> mfu;
  cmMakefile* mf;
  if (!this->Makefiles.empty()) {
    mf = this->Makefiles[0];
  } else {
    cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(
      this->CMakeInstance->GetHomeDirectory());
    snapshot.GetDirectory().SetCurrentBinary(
      this->CMakeInstance->GetHomeOutputDirectory());
    snapshot.SetDefaultDefinitions();
    mfu = cm::make_unique<cmMakefile>(this, snapshot);
    mf = mfu.get();
  }

  GeneratedMakeCommand makeCommand;

  // Make it possible to set verbosity also from command line
  if (verbose) {
    makeCommand.Add(cmSystemTools::GetCMakeCommand());
    makeCommand.Add("-E");
    makeCommand.Add("env");
    makeCommand.Add("VERBOSE=1");
  }
  makeCommand.Add(this->SelectMakeProgram(makeProgram));

  if (jobs != cmake::NO_BUILD_PARALLEL_LEVEL) {
    makeCommand.Add("-j");
    if (jobs != cmake::DEFAULT_BUILD_PARALLEL_LEVEL) {
      makeCommand.Add(std::to_string(jobs));
    }
  }

  makeCommand.Add(makeOptions.begin(), makeOptions.end());
  for (auto tname : targetNames) {
    if (!tname.empty()) {
      if (fast) {
        tname += "/fast";
      }
      tname =
        mf->GetStateSnapshot().GetDirectory().ConvertToRelPathIfNotContained(
          mf->GetState()->GetBinaryDirectory(), tname);
      cmSystemTools::ConvertToOutputSlashes(tname);
      makeCommand.Add(std::move(tname));
    }
  }
  return { std::move(makeCommand) };
}